

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ConnectorFederateManager::disconnectAllConnectors(ConnectorFederateManager *this)

{
  Translator **ppTVar1;
  int iVar2;
  handle trans;
  handle filts;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> local_98;
  iterator local_80;
  iterator local_68;
  handle local_50;
  handle local_38;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_38,&this->filters);
  gmlc::containers::
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  ::begin((iterator *)&local_68,&(local_38.data)->dataStorage);
  gmlc::containers::
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  ::end((iterator *)&local_80,&(local_38.data)->dataStorage);
  iVar2 = local_80.offset;
  ppTVar1 = local_80.vec;
  local_98.vec = local_68.vec;
  local_98.ptr = local_68.ptr;
  local_98.offset = local_68.offset;
  local_98._20_4_ = local_68._20_4_;
  while ((local_98.offset != iVar2 || (local_98.vec != ppTVar1))) {
    Interface::disconnectFromCore((Interface *)((local_98.ptr)->super_Interface)._vptr_Interface);
    gmlc::containers::
    BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
    ::operator++((BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
                  *)&local_98);
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_50,&this->translators);
  gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
  begin(&local_68,&(local_50.data)->dataStorage);
  gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
  end(&local_80,&(local_50.data)->dataStorage);
  local_98.vec = local_68.vec;
  local_98.ptr = local_68.ptr;
  local_98.offset = local_68.offset;
  local_98._20_4_ = local_68._20_4_;
  while ((local_98.offset != local_80.offset || (local_98.vec != local_80.vec))) {
    Interface::disconnectFromCore(&(local_98.ptr)->super_Interface);
    gmlc::containers::BlockIterator<helics::Translator,_32,_helics::Translator_**>::operator++
              (&local_98);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_50.m_handle_lock);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_38.m_handle_lock);
  return;
}

Assistant:

void ConnectorFederateManager::disconnectAllConnectors()
{
    auto filts = filters.lock();
    filts->modify([](auto& filt) { filt->disconnectFromCore(); });

    auto trans = translators.lock();
    trans->modify([](auto& tran) { tran.disconnectFromCore(); });
}